

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_isPrototypeOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue JVar1;
  byte bVar2;
  int iVar3;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar4;
  JSValue JVar5;
  int res;
  JSValue v;
  JSValue v1;
  JSValue obj;
  JSContext *in_stack_ffffffffffffff38;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_ffffffffffffff48;
  JSValueUnion JVar6;
  JSValueUnion local_a0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int64_t iVar8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_c;
  
  JVar5 = *in_R8;
  iVar3 = JS_IsObject(*in_R8);
  if (iVar3 == 0) {
    uVar7 = 0;
    iVar8 = 1;
  }
  else {
    JVar4.tag._0_4_ = in_stack_ffffffffffffffe0;
    JVar4.u = (JSValueUnion)in_stack_ffffffffffffffd8;
    JVar4.tag._4_4_ = in_stack_ffffffffffffffe4;
    JVar4 = JS_ToObject((JSContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        JVar4);
    local_a0 = JVar4.u;
    iVar3 = JS_IsException(JVar4);
    if (iVar3 == 0) {
      JVar5 = JS_DupValue(in_RDI,JVar5);
      JVar6 = JVar5.u;
      iVar8 = JVar5.tag;
      do {
        JVar5.tag = iVar8;
        JVar5.u.ptr = JVar6.ptr;
        JVar5 = JS_GetPrototypeFree((JSContext *)in_stack_ffffffffffffff48.ptr,JVar5);
        in_stack_ffffffffffffff48 = (JSValueUnion)JVar5.tag;
        ctx_00 = JVar5.u;
        iVar3 = JS_IsException(JVar5);
        if (iVar3 != 0) break;
        iVar3 = JS_IsNull(JVar5);
        if (iVar3 != 0) {
          bVar2 = 0;
LAB_001aad2c:
          v_00.tag = (int64_t)JVar6.ptr;
          v_00.u.ptr = in_stack_ffffffffffffff48.ptr;
          JS_FreeValue((JSContext *)ctx_00.ptr,v_00);
          v_01.tag = (int64_t)JVar6.ptr;
          v_01.u.ptr = in_stack_ffffffffffffff48.ptr;
          JS_FreeValue((JSContext *)ctx_00.ptr,v_01);
          uVar7 = (uint)bVar2;
          iVar8 = 1;
          in_stack_ffffffffffffffd4 = uStack_c;
          goto LAB_001aadfe;
        }
        if (local_a0.ptr == JVar5.u.ptr) {
          bVar2 = 1;
          goto LAB_001aad2c;
        }
        iVar3 = js_poll_interrupts(in_stack_ffffffffffffff38);
      } while (iVar3 == 0);
      v_02.tag = (int64_t)JVar6.ptr;
      v_02.u.ptr = in_stack_ffffffffffffff48.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v_02);
      v_03.tag = (int64_t)JVar6.ptr;
      v_03.u.ptr = in_stack_ffffffffffffff48.ptr;
      JS_FreeValue((JSContext *)ctx_00.ptr,v_03);
      uVar7 = 0;
      iVar8 = 6;
    }
    else {
      uVar7 = 0;
      iVar8 = 6;
    }
  }
LAB_001aadfe:
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar7;
  JVar1.tag = iVar8;
  return JVar1;
}

Assistant:

static JSValue js_object_isPrototypeOf(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue obj, v1;
    JSValueConst v;
    int res;

    v = argv[0];
    if (!JS_IsObject(v))
        return JS_FALSE;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    v1 = JS_DupValue(ctx, v);
    for(;;) {
        v1 = JS_GetPrototypeFree(ctx, v1);
        if (JS_IsException(v1))
            goto exception;
        if (JS_IsNull(v1)) {
            res = FALSE;
            break;
        }
        if (JS_VALUE_GET_OBJ(obj) == JS_VALUE_GET_OBJ(v1)) {
            res = TRUE;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_NewBool(ctx, res);

exception:
    JS_FreeValue(ctx, v1);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}